

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector> __thiscall
wasm::TopologicalOrdersImpl<std::monostate>::Selector::advance
          (Selector *this,TopologicalOrdersImpl<std::monostate> *ctx)

{
  uint uVar1;
  value_type vVar2;
  bool bVar3;
  reference pvVar4;
  const_reference this_00;
  reference puVar5;
  reference __b;
  Index extraout_var;
  fd_set *__writefds;
  fd_set *__readfds;
  fd_set *in_R8;
  timeval *in_R9;
  Selector local_60;
  uint local_50;
  uint local_4c;
  Index i;
  uint child;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  value_type unselected;
  TopologicalOrdersImpl<std::monostate> *ctx_local;
  Selector *this_local;
  
  if (this->count != 0) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&ctx->buf,(ulong)this->start);
    uVar1 = *pvVar4;
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](ctx->graph,(ulong)uVar1);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    _i = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&i);
      if (!bVar3) break;
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      local_4c = *puVar5;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&ctx->indegrees,(ulong)local_4c);
      *pvVar4 = *pvVar4 + 1;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
    if (this->index == this->count - 1) {
      for (local_50 = 1; local_50 < this->count; local_50 = local_50 + 1) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&ctx->buf,(ulong)(this->start + local_50));
        vVar2 = *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&ctx->buf,(ulong)((this->start + local_50) - 1));
        *pvVar4 = vVar2;
      }
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&ctx->buf,(ulong)((this->start + this->count) - 1));
      *pvVar4 = uVar1;
      std::optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector>::optional
                ((optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector> *)&this_local);
    }
    else {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&ctx->buf,(ulong)this->start);
      uVar1 = this->index;
      this->index = uVar1 + 1;
      __writefds = (fd_set *)(ulong)uVar1;
      __b = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (&ctx->buf,(ulong)(this->start + 1 + uVar1));
      std::swap<unsigned_int>(pvVar4,__b);
      local_60.start = select(this,(int)ctx,__readfds,__writefds,in_R8,in_R9);
      local_60.count = extraout_var;
      std::optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector>::
      optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true>
                ((optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector> *)&this_local,
                 &local_60);
    }
    return (_Optional_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true,_true>)
           (_Optional_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true,_true>)
           _this_local;
  }
  __assert_fail("count >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                ,0xfb,
                "std::optional<Selector> wasm::TopologicalOrdersImpl<>::Selector::advance(TopologicalOrdersImpl<F> &) [F = std::monostate]"
               );
}

Assistant:

std::optional<Selector> advance(TopologicalOrdersImpl& ctx) {
      assert(count >= 1);
      // Undo the current selection. Backtrack by incrementing the in-degree for
      // each child of the vertex we are unselecting. No need to remove the
      // newly unavailable children from the buffer; they will be overwritten
      // with valid selections.
      auto unselected = ctx.buf[start];
      for (auto child : ctx.graph[unselected]) {
        ++ctx.indegrees[child];
      }
      if (index == count - 1) {
        // We are wrapping back to the original configuration. The current
        // selection element needs to go back on the end and everything else
        // needs to be shifted back to its original location. This ensures that
        // we leave everything how we found it so the previous selector can make
        // its next selection without observing anything having changed in the
        // meantime.
        for (Index i = 1; i < count; ++i) {
          ctx.buf[start + i - 1] = ctx.buf[start + i];
        }
        ctx.buf[start + count - 1] = unselected;
        return std::nullopt;
      }
      // Otherwise, just swap the next selection into the first position and
      // finalize the selection.
      std::swap(ctx.buf[start], ctx.buf[start + ++index]);
      return select(ctx);
    }